

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O2

bool Js::FunctionBody::DoStackClosure<Js::FunctionBody_const*>(FunctionBody *functionBody)

{
  NestedArray *pNVar1;
  bool bVar2;
  
  if ((((functionBody->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) != Flags_None) &&
     (pNVar1 = (functionBody->super_ParseableFunctionInfo).nestedArray.ptr,
     pNVar1 != (NestedArray *)0x0)) {
    if ((pNVar1->nestedCount == 0) ||
       ((functionBody->super_ParseableFunctionInfo).scopeSlotArraySize == 0)) {
      bVar2 = false;
    }
    else {
      bVar2 = functionBody->m_envDepth != 0xffff;
    }
    return bVar2;
  }
  return false;
}

Assistant:

static bool DoStackNestedFunc(FunctionBodyFlags flags) { return (flags & Flags_StackNestedFunc) != 0; }